

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# IO.h
# Opt level: O2

ssize_t __thiscall nanovdb::io::Segment::read(Segment *this,int __fd,void *__buf,size_t __nbytes)

{
  uint uVar1;
  uint64_t uVar2;
  pointer pGVar3;
  long extraout_RAX;
  long lVar4;
  ostream *poVar5;
  runtime_error *prVar6;
  void *extraout_RDX;
  void *__buf_00;
  void *extraout_RDX_00;
  undefined4 in_register_00000034;
  long *plVar7;
  GridMetaData *m;
  pointer this_00;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> bStack_1e8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_1c8;
  stringstream ss;
  ostream local_198 [376];
  
  plVar7 = (long *)CONCAT44(in_register_00000034,__fd);
  std::istream::read((char *)plVar7,(long)this);
  lVar4 = *(long *)(*plVar7 + -0x18);
  uVar1 = *(uint *)((long)plVar7 + lVar4 + 0x20);
  if ((uVar1 & 2) == 0) {
    uVar2 = (this->header).magic;
    if (((uVar1 & 5) != 0) || (uVar2 != 0x304244566f6e614e)) {
      prVar6 = (runtime_error *)__cxa_allocate_exception(0x10);
      if (uVar2 == 0x4e616e6f56444230) {
        std::runtime_error::runtime_error(prVar6,"This nvdb file has opposite endianness");
      }
      else {
        std::runtime_error::runtime_error
                  (prVar6,"Magic number error: This is not a valid nvdb file");
      }
      __cxa_throw(prVar6,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
    }
    if ((this->header).major != 0x13) {
      std::__cxx11::stringstream::stringstream((stringstream *)&ss);
      poVar5 = std::operator<<(local_198,"Read version ");
      poVar5 = (ostream *)std::ostream::operator<<(poVar5,(this->header).major);
      poVar5 = std::operator<<(poVar5,".");
      poVar5 = (ostream *)std::ostream::operator<<(poVar5,(this->header).minor);
      poVar5 = std::operator<<(poVar5," but expected version ");
      poVar5 = (ostream *)std::ostream::operator<<(poVar5,0x13);
      poVar5 = std::operator<<(poVar5,".x");
      std::endl<char,std::char_traits<char>>(poVar5);
      prVar6 = (runtime_error *)__cxa_allocate_exception(0x10);
      std::__cxx11::stringbuf::str();
      std::operator+(&local_1c8,"Incompatible file format: ",&bStack_1e8);
      std::runtime_error::runtime_error(prVar6,(string *)&local_1c8);
      __cxa_throw(prVar6,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
    }
    std::vector<nanovdb::io::GridMetaData,_std::allocator<nanovdb::io::GridMetaData>_>::resize
              (&this->meta,(ulong)(this->header).gridCount);
    pGVar3 = (this->meta).
             super__Vector_base<nanovdb::io::GridMetaData,_std::allocator<nanovdb::io::GridMetaData>_>
             ._M_impl.super__Vector_impl_data._M_finish;
    lVar4 = extraout_RAX;
    __buf_00 = extraout_RDX;
    for (this_00 = (this->meta).
                   super__Vector_base<nanovdb::io::GridMetaData,_std::allocator<nanovdb::io::GridMetaData>_>
                   ._M_impl.super__Vector_impl_data._M_start; this_00 != pGVar3;
        this_00 = this_00 + 1) {
      lVar4 = GridMetaData::read(this_00,__fd,__buf_00,__nbytes);
      __buf_00 = extraout_RDX_00;
    }
  }
  return CONCAT71((int7)((ulong)lVar4 >> 8),(uVar1 & 2) == 0);
}

Assistant:

inline bool Segment::read(std::istream& is)
{
    is.read(reinterpret_cast<char*>(&header), sizeof(Header));
    if (is.eof())
        return false;
    Header h;
    if (!is || header.magic != NANOVDB_MAGIC_NUMBER) {
        // first check for byte-swapped header magic.
        if (header.magic == reverseEndianness(NANOVDB_MAGIC_NUMBER))
            throw std::runtime_error("This nvdb file has opposite endianness");
        throw std::runtime_error("Magic number error: This is not a valid nvdb file");
    }
    if (header.major != h.major) {
        std::stringstream ss;
        ss << "Read version " << header.major << "." << header.minor
           << " but expected version " << h.major << ".x" << std::endl;
        throw std::runtime_error("Incompatible file format: " + ss.str());
    }
    meta.resize(header.gridCount);
    for (auto& m : meta)
        m.read(is);
    return true;
}